

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureFormatTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::TextureBufferFormatCase::init
          (TextureBufferFormatCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  deUint32 internalFormat;
  TextureFormat TVar1;
  ContextInfo *pCVar2;
  RenderContext *context;
  bool bVar3;
  ContextType ctxType;
  int iVar4;
  int iVar5;
  int extraout_EAX;
  TextureBuffer *this_01;
  NotSupportedError *this_02;
  Vec4 colorB;
  Vec4 colorA;
  TextureFormat fmt;
  TextureFormatInfo spec;
  Vec4 local_230;
  Vec4 local_220;
  TextureFormat local_210;
  LogGradientFmt local_208;
  Enum<int,_2UL> local_1f8;
  TextureFormatInfo local_1e8;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  TVar1 = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_210 = glu::mapGLInternalFormat(this->m_format);
  tcu::getTextureFormatInfo(&local_1e8,&local_210);
  local_220.m_data[0] = local_1e8.valueMin.m_data[0];
  local_220.m_data[1] = local_1e8.valueMax.m_data[1];
  local_220.m_data[2] = local_1e8.valueMin.m_data[2];
  local_220.m_data[3] = local_1e8.valueMax.m_data[3];
  local_230.m_data[0] = local_1e8.valueMax.m_data[0];
  local_230.m_data[1] = local_1e8.valueMin.m_data[1];
  local_230.m_data[2] = local_1e8.valueMax.m_data[2];
  local_230.m_data[3] = local_1e8.valueMin.m_data[3];
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar3) {
    bVar3 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,"GL_OES_texture_buffer");
    if (!bVar3) {
      bVar3 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_texture_buffer");
      if (!bVar3) {
        this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (this_02,"Texture buffers not supported",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureFormatTests.cpp"
                   ,299);
        goto LAB_014df394;
      }
    }
  }
  pCVar2 = ((this->super_TestCase).m_context)->m_contextInfo;
  iVar4 = (*pCVar2->_vptr_ContextInfo[2])(pCVar2,0x8c2b);
  this->m_maxTextureBufferSize = iVar4;
  if (0 < iVar4) {
    this_00 = (ostringstream *)(local_1a8 + 8);
    local_1a8._0_8_ = TVar1;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Buffer texture, ",0x10);
    local_1f8.m_value = this->m_format;
    local_1f8.m_getName = glu::getTextureFormatName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1f8,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,this->m_width);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",\n  fill with ",0xe);
    local_208.valueMin = &local_220;
    local_208.valueMax = &local_230;
    glu::TextureTestUtil::operator<<((ostream *)this_00,&local_208);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," gradient",9);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_130);
    this_01 = (TextureBuffer *)operator_new(0x38);
    context = this->m_renderCtx;
    internalFormat = this->m_format;
    iVar4 = this->m_width;
    iVar5 = tcu::TextureFormat::getPixelSize(&local_210);
    glu::TextureBuffer::TextureBuffer(this_01,context,internalFormat,(long)(iVar5 * iVar4));
    this->m_texture = this_01;
    glu::TextureBuffer::getFullRefTexture((PixelBufferAccess *)local_1a8,this_01);
    tcu::fillWithComponentGradients((PixelBufferAccess *)local_1a8,&local_220,&local_230);
    return extraout_EAX;
  }
  this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_02,"GL_MAX_TEXTURE_BUFFER_SIZE > 0 required",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureFormatTests.cpp"
             ,0x131);
LAB_014df394:
  __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureBufferFormatCase::init (void)
{
	TestLog&				log				= m_testCtx.getLog();
	tcu::TextureFormat		fmt				= glu::mapGLInternalFormat(m_format);
	tcu::TextureFormatInfo	spec			= tcu::getTextureFormatInfo(fmt);
	tcu::Vec4				colorA			(spec.valueMin.x(), spec.valueMax.y(), spec.valueMin.z(), spec.valueMax.w());
	tcu::Vec4				colorB			(spec.valueMax.x(), spec.valueMin.y(), spec.valueMax.z(), spec.valueMin.w());
	const bool				supportsES32	= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32
		&& !m_context.getContextInfo().isExtensionSupported("GL_OES_texture_buffer")
		&& !m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_buffer"))
	{
		TCU_THROW(NotSupportedError, "Texture buffers not supported");
	}

	m_maxTextureBufferSize = m_context.getContextInfo().getInt(GL_MAX_TEXTURE_BUFFER_SIZE);

	if (m_maxTextureBufferSize <= 0)
		TCU_THROW(NotSupportedError, "GL_MAX_TEXTURE_BUFFER_SIZE > 0 required");

	log << TestLog::Message << "Buffer texture, " << glu::getTextureFormatStr(m_format) << ", " << m_width
							<< ",\n  fill with " << formatGradient(&colorA, &colorB) << " gradient"
		<< TestLog::EndMessage;

	m_texture = new glu::TextureBuffer(m_renderCtx, m_format, m_width * fmt.getPixelSize());

	// Fill level 0.
	tcu::fillWithComponentGradients(m_texture->getFullRefTexture(), colorA, colorB);
}